

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

void stream_write_callback(pa_stream *s,size_t nbytes,void *u)

{
  if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (CUBEB_LOG_NORMAL < g_cubeb_log_level)) {
    (*g_cubeb_log_callback)
              ("%s:%d: Output callback to be written buffer size %zd\n","cubeb_pulse.c",0x155,nbytes
              );
  }
  if (((*(int *)((long)u + 0x50) == 0) && (*(int *)((long)u + 0x58) == 0)) &&
     (*(long *)((long)u + 0x18) == 0)) {
    trigger_user_callback(s,(void *)0x0,nbytes,(cubeb_stream_conflict *)u);
    return;
  }
  return;
}

Assistant:

static void
stream_write_callback(pa_stream * s, size_t nbytes, void * u)
{
  LOGV("Output callback to be written buffer size %zd", nbytes);
  cubeb_stream * stm = u;
  if (stm->shutdown ||
      stm->state != CUBEB_STATE_STARTED) {
    return;
  }

  if (!stm->input_stream){
    // Output/playback only operation.
    // Write directly to output
    assert(!stm->input_stream && stm->output_stream);
    trigger_user_callback(s, NULL, nbytes, stm);
  }
}